

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
emplaceRealloc<slang::IntervalMap<unsigned_long,std::monostate,3u>>
          (SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *this,pointer pos,
          IntervalMap<unsigned_long,_std::monostate,_3U> *args)

{
  ulong uVar1;
  long lVar2;
  IntervalMap<unsigned_long,_std::monostate,_3U> *__result;
  IntervalMap<unsigned_long,_std::monostate,_3U> *__result_00;
  ulong uVar3;
  move_iterator<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*> __last;
  move_iterator<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*> __first;
  IntervalMap<unsigned_long,_std::monostate,_3U> *this_00;
  
  if (*(long *)(this + 8) == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar3 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar3 < uVar1 * 2) {
    uVar3 = uVar1 * 2;
  }
  if (0x1ffffffffffffff - uVar1 < uVar1) {
    uVar3 = 0x1ffffffffffffff;
  }
  lVar2 = *(long *)this;
  __result = (IntervalMap<unsigned_long,_std::monostate,_3U> *)operator_new(uVar3 << 6);
  this_00 = (IntervalMap<unsigned_long,_std::monostate,_3U> *)(((long)pos - lVar2) + (long)__result)
  ;
  IntervalMap<unsigned_long,_std::monostate,_3U>::IntervalMap(this_00,args);
  __first._M_current = *(IntervalMap<unsigned_long,_std::monostate,_3U> **)this;
  __last._M_current = __first._M_current + *(long *)(this + 8);
  __result_00 = __result;
  if (__last._M_current != pos) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<slang::IntervalMap<unsigned_long,std::monostate,3u>*>,slang::IntervalMap<unsigned_long,std::monostate,3u>*>
              (__first,(move_iterator<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*>)pos,
               __result);
    __last._M_current =
         (IntervalMap<unsigned_long,_std::monostate,_3U> *)
         (*(long *)(this + 8) * 0x40 + *(long *)this);
    __result_00 = this_00 + 1;
    __first._M_current = pos;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::IntervalMap<unsigned_long,std::monostate,3u>*>,slang::IntervalMap<unsigned_long,std::monostate,3u>*>
            (__first,__last,__result_00);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)this,
             (EVP_PKEY_CTX *)__last._M_current);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar3;
  *(IntervalMap<unsigned_long,_std::monostate,_3U> **)this = __result;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}